

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_executor.hpp
# Opt level: O2

void duckdb::UnaryExecutor::
     ExecuteFlat<long,unsigned_int,duckdb::GenericUnaryWrapper,duckdb::VectorTryCastOperator<duckdb::NumericTryCast>>
               (long *ldata,uint *result_data,idx_t count,ValidityMask *mask,
               ValidityMask *result_mask,void *dataptr,bool adds_nulls)

{
  unsigned_long *puVar1;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  ulong idx;
  idx_t i;
  idx_t iVar5;
  ulong uVar6;
  ulong uVar7;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    for (iVar5 = 0; count != iVar5; iVar5 = iVar5 + 1) {
      uVar3 = VectorTryCastOperator<duckdb::NumericTryCast>::Operation<long,unsigned_int>
                        (ldata[iVar5],result_mask,iVar5,dataptr);
      result_data[iVar5] = uVar3;
    }
  }
  else {
    if (adds_nulls) {
      TemplatedValidityMask<unsigned_long>::Copy
                (&result_mask->super_TemplatedValidityMask<unsigned_long>,
                 &mask->super_TemplatedValidityMask<unsigned_long>,count);
    }
    else {
      TemplatedValidityMask<unsigned_long>::Initialize
                (&result_mask->super_TemplatedValidityMask<unsigned_long>,
                 &mask->super_TemplatedValidityMask<unsigned_long>);
    }
    iVar5 = 0;
    for (uVar4 = 0; uVar4 != count + 0x3f >> 6; uVar4 = uVar4 + 1) {
      puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar1 == (unsigned_long *)0x0) {
        uVar7 = iVar5 + 0x40;
        if (count <= iVar5 + 0x40) {
          uVar7 = count;
        }
LAB_0141e65f:
        for (; idx = iVar5, iVar5 < uVar7; iVar5 = iVar5 + 1) {
          uVar3 = VectorTryCastOperator<duckdb::NumericTryCast>::Operation<long,unsigned_int>
                            (ldata[iVar5],result_mask,iVar5,dataptr);
          result_data[iVar5] = uVar3;
        }
      }
      else {
        uVar2 = puVar1[uVar4];
        uVar7 = iVar5 + 0x40;
        if (count <= iVar5 + 0x40) {
          uVar7 = count;
        }
        if (uVar2 == 0xffffffffffffffff) goto LAB_0141e65f;
        idx = uVar7;
        if (uVar2 != 0) {
          for (uVar6 = 0; idx = iVar5 + uVar6, idx < uVar7; uVar6 = uVar6 + 1) {
            if ((uVar2 >> (uVar6 & 0x3f) & 1) != 0) {
              uVar3 = VectorTryCastOperator<duckdb::NumericTryCast>::Operation<long,unsigned_int>
                                (ldata[iVar5 + uVar6],result_mask,idx,dataptr);
              result_data[iVar5 + uVar6] = uVar3;
            }
          }
        }
      }
      iVar5 = idx;
    }
  }
  return;
}

Assistant:

static inline void ExecuteFlat(const INPUT_TYPE *__restrict ldata, RESULT_TYPE *__restrict result_data, idx_t count,
	                               ValidityMask &mask, ValidityMask &result_mask, void *dataptr, bool adds_nulls) {
		ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);

		if (!mask.AllValid()) {
			if (!adds_nulls) {
				result_mask.Initialize(mask);
			} else {
				result_mask.Copy(mask, count);
			}
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						result_data[base_idx] = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
						    ldata[base_idx], result_mask, base_idx, dataptr);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							D_ASSERT(mask.RowIsValid(base_idx));
							result_data[base_idx] = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
							    ldata[base_idx], result_mask, base_idx, dataptr);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				result_data[i] =
				    OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(ldata[i], result_mask, i, dataptr);
			}
		}
	}